

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>_> __thiscall
wabt::
MakeUnique<wabt::interp::FuncType,std::vector<wabt::Type,std::allocator<wabt::Type>>,std::vector<wabt::Type,std::allocator<wabt::Type>>>
          (wabt *this,vector<wabt::Type,_std::allocator<wabt::Type>_> *args,
          vector<wabt::Type,_std::allocator<wabt::Type>_> *args_1)

{
  undefined8 *puVar1;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_58;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_38;
  
  puVar1 = (undefined8 *)operator_new(0x40);
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)(puVar1 + 1) = 0;
  *puVar1 = &PTR__FuncType_001e48a0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(puVar1 + 2),&local_58);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(puVar1 + 5),&local_38);
  *(undefined8 **)this = puVar1;
  if (local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (__uniq_ptr_data<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>,_true,_true>
          )(__uniq_ptr_data<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}